

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O1

string * __thiscall
helics::FilterFederate::query_abi_cxx11_
          (string *__return_storage_ptr__,FilterFederate *this,string_view queryStr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  pointer pcVar4;
  void *pvVar5;
  size_type sVar6;
  int iVar7;
  reference pvVar8;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar9;
  string *psVar10;
  string *psVar11;
  long lVar12;
  size_t __n;
  char *pcVar13;
  GlobalFederateId *dep;
  int *piVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  TimeCoordinator *pTVar16;
  size_type __rlen;
  json base;
  json base_5;
  json filter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  data local_2d8;
  TimeCoordinator *local_2c0;
  data local_2b8;
  data local_2a8;
  data local_298;
  data local_288;
  data local_278;
  data local_268;
  data local_258;
  data local_248;
  data local_238;
  data local_228;
  data local_218;
  data local_208;
  data local_1f8;
  data local_1e8;
  data local_1d8;
  data local_1c8;
  data local_1b8;
  data local_1a8;
  data local_198;
  data local_188;
  data local_178;
  data local_168;
  data local_150;
  data local_140;
  data local_130;
  data local_120;
  data local_110;
  data local_100;
  data local_f0;
  data local_e0;
  data local_d0;
  data local_c0;
  data local_b0;
  data local_a0;
  data local_90;
  data local_80;
  data local_70;
  data local_60;
  data local_50;
  data local_40;
  
  pcVar13 = queryStr._M_str;
  __n = queryStr._M_len;
  lVar12 = __n - 5;
  local_300 = __return_storage_ptr__;
  switch(lVar12) {
  case 0:
switchD_00363a87_caseD_0:
    iVar7 = bcmp(pcVar13,"state",__n);
    if (iVar7 == 0) {
      psVar11 = fedStateString_abi_cxx11_(this->current_state);
      psVar10 = local_300;
      (local_300->_M_dataplus)._M_p = (pointer)&local_300->field_2;
      pcVar4 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_300,pcVar4,pcVar4 + psVar11->_M_string_length);
      return psVar10;
    }
    switch(__n) {
    case 6:
switchD_00363b93_caseD_6:
      iVar7 = bcmp(pcVar13,"inputs",__n);
      if (iVar7 == 0) goto LAB_00363df5;
      switch(__n) {
      case 6:
        goto switchD_00363dbb_caseD_6;
      default:
        break;
      case 9:
        goto switchD_00363a87_caseD_4;
      case 10:
        goto switchD_00363a87_caseD_5;
      case 0xb:
        goto switchD_00363a87_caseD_6;
      case 0xc:
        goto switchD_00363c03_caseD_c;
      case 0xd:
        goto switchD_00363a87_caseD_8;
      case 0xf:
        goto switchD_00363a87_caseD_a;
      case 0x10:
        goto switchD_00363a87_caseD_b;
      case 0x12:
        goto switchD_00363a87_caseD_d;
      case 0x15:
        goto switchD_00363a87_caseD_10;
      }
    case 9:
      goto switchD_00363a87_caseD_4;
    case 10:
      goto switchD_00363a87_caseD_5;
    case 0xb:
      goto switchD_00363a87_caseD_6;
    case 0xc:
      goto switchD_00363a87_caseD_7;
    case 0xd:
      goto switchD_00363a87_caseD_8;
    case 0xf:
      goto switchD_00363a87_caseD_a;
    case 0x10:
      goto switchD_00363a87_caseD_b;
    case 0x12:
      goto switchD_00363a87_caseD_d;
    case 0x15:
      goto switchD_00363a87_caseD_10;
    }
    break;
  case 1:
    iVar7 = bcmp(pcVar13,"exists",__n);
    if (iVar7 == 0) {
LAB_00364039:
      (local_300->_M_dataplus)._M_p = (pointer)&local_300->field_2;
      pcVar15 = "true";
      pcVar13 = "";
      goto LAB_00364151;
    }
    switch(lVar12) {
    case 0:
      goto switchD_00363a87_caseD_0;
    case 1:
      goto switchD_00363b27_caseD_1;
    case 2:
      goto switchD_00363a87_caseD_2;
    case 4:
      goto switchD_00363a87_caseD_4;
    case 5:
      goto switchD_00363a87_caseD_5;
    case 6:
      goto switchD_00363a87_caseD_6;
    case 7:
      goto switchD_00363a87_caseD_7;
    case 8:
      goto switchD_00363a87_caseD_8;
    case 10:
      goto switchD_00363a87_caseD_a;
    case 0xb:
      goto switchD_00363a87_caseD_b;
    case 0xd:
      goto switchD_00363a87_caseD_d;
    case 0x10:
      goto switchD_00363a87_caseD_10;
    }
    break;
  case 2:
switchD_00363a87_caseD_2:
    iVar7 = bcmp(pcVar13,"version",__n);
    if (iVar7 == 0) {
      (local_300->_M_dataplus)._M_p = (pointer)&local_300->field_2;
      pcVar15 = "3.6.1 (2025-02-24)";
      pcVar13 = "";
      goto LAB_00364151;
    }
    switch(lVar12) {
    case 0:
      goto switchD_00363a87_caseD_0;
    case 1:
switchD_00363b27_caseD_1:
      iVar7 = bcmp(pcVar13,"isinit",__n);
      if (iVar7 == 0) goto LAB_00364039;
      switch(lVar12) {
      case 0:
        goto switchD_00363a87_caseD_0;
      case 1:
        goto switchD_00363b93_caseD_6;
      default:
        break;
      case 4:
        goto switchD_00363a87_caseD_4;
      case 5:
        goto switchD_00363a87_caseD_5;
      case 6:
        goto switchD_00363a87_caseD_6;
      case 7:
        goto switchD_00363a87_caseD_7;
      case 8:
        goto switchD_00363a87_caseD_8;
      case 10:
        goto switchD_00363a87_caseD_a;
      case 0xb:
        goto switchD_00363a87_caseD_b;
      case 0xd:
        goto switchD_00363a87_caseD_d;
      case 0x10:
        goto switchD_00363a87_caseD_10;
      }
    case 4:
      goto switchD_00363a87_caseD_4;
    case 5:
      goto switchD_00363a87_caseD_5;
    case 6:
      goto switchD_00363a87_caseD_6;
    case 7:
      goto switchD_00363a87_caseD_7;
    case 8:
      goto switchD_00363a87_caseD_8;
    case 10:
      goto switchD_00363a87_caseD_a;
    case 0xb:
      goto switchD_00363a87_caseD_b;
    case 0xd:
      goto switchD_00363a87_caseD_d;
    case 0x10:
      goto switchD_00363a87_caseD_10;
    }
    break;
  case 4:
switchD_00363a87_caseD_4:
    iVar7 = bcmp(pcVar13,"endpoints",__n);
    if (iVar7 == 0) goto LAB_00363df5;
    switch(__n) {
    case 6:
      goto switchD_00363dbb_caseD_6;
    case 10:
      goto switchD_00363a87_caseD_5;
    case 0xb:
      goto switchD_00363a87_caseD_6;
    case 0xc:
      goto switchD_00363c03_caseD_c;
    case 0xd:
      goto switchD_00363a87_caseD_8;
    case 0xf:
      goto switchD_00363a87_caseD_a;
    case 0x10:
      goto switchD_00363a87_caseD_b;
    case 0x15:
      goto switchD_00363a87_caseD_10;
    }
    break;
  case 5:
switchD_00363a87_caseD_5:
    iVar7 = bcmp(pcVar13,"interfaces",__n);
    if (iVar7 != 0) {
      switch(__n) {
      case 6:
        goto switchD_00363dbb_caseD_6;
      case 10:
        goto switchD_00363dbb_caseD_a;
      case 0xb:
        goto switchD_00363a87_caseD_6;
      case 0xc:
        goto switchD_00363c03_caseD_c;
      case 0xd:
        goto switchD_00363c73_caseD_d;
      case 0xf:
        goto switchD_00363a87_caseD_a;
      case 0x10:
        goto switchD_00363a87_caseD_b;
      case 0x15:
        goto switchD_00363a87_caseD_10;
      }
      break;
    }
    goto LAB_00363df5;
  case 6:
switchD_00363a87_caseD_6:
    iVar7 = bcmp(pcVar13,"global_time",__n);
    if (iVar7 == 0) {
      local_320._M_dataplus._M_p._0_1_ = 0;
      local_320._M_string_length = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_100,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_320,"attributes");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_100.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_100.m_value;
      local_100.m_type = vVar2;
      local_100.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_100);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_320,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_110.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_110.m_value;
      local_110.m_type = vVar2;
      local_110.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_110);
      local_228.m_type = null;
      local_228._1_7_ = 0;
      local_228.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_228,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_320,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"id");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_228.m_type;
      local_228.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_228.m_value;
      local_228.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_228);
      local_238.m_type = null;
      local_238._1_7_ = 0;
      local_238.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_238,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_320,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_238.m_type;
      local_238.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_238.m_value;
      local_238.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_238);
      lVar12 = (this->mCoord).time_granted.internalTimeCode;
      local_248.m_type = null;
      local_248._1_7_ = 0;
      local_248.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_248,(double)(lVar12 % 1000000000) * 1e-09 + (double)(lVar12 / 1000000000)
                );
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_320,"granted_time");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_248.m_type;
      local_248.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_248.m_value;
      local_248.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_248);
      lVar12 = (this->mCoord).info.outputDelay.internalTimeCode +
               (this->mCoord).time_granted.internalTimeCode;
      local_258.m_type = null;
      local_258._1_7_ = 0;
      local_258.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_258,(double)(lVar12 % 1000000000) * 1e-09 + (double)(lVar12 / 1000000000)
                );
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_320,"send_time");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_258.m_type;
      local_258.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_258.m_value;
      local_258.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_258);
      fileops::generateJsonString(local_300,(json *)&local_320,true);
LAB_00364fa0:
      this_00 = &local_320;
      goto LAB_00364fa5;
    }
    if (__n == 0x10) goto switchD_00363a87_caseD_b;
    break;
  case 7:
switchD_00363a87_caseD_7:
    iVar7 = bcmp(pcVar13,"publications",__n);
    if (iVar7 != 0) {
      switch(__n) {
      case 6:
        goto switchD_00363b93_caseD_6;
      default:
        goto switchD_00363a87_caseD_3;
      case 9:
        goto switchD_00363a87_caseD_4;
      case 10:
        goto switchD_00363a87_caseD_5;
      case 0xb:
        goto switchD_00363a87_caseD_6;
      case 0xc:
        goto switchD_00363c03_caseD_c;
      case 0xd:
        goto switchD_00363a87_caseD_8;
      case 0xf:
        goto switchD_00363a87_caseD_a;
      case 0x10:
        goto switchD_00363a87_caseD_b;
      case 0x12:
        goto switchD_00363a87_caseD_d;
      case 0x15:
        goto switchD_00363a87_caseD_10;
      }
    }
    goto LAB_00363df5;
  case 8:
switchD_00363a87_caseD_8:
    iVar7 = bcmp(pcVar13,"subscriptions",__n);
    if (iVar7 != 0) {
      switch(__n) {
      case 6:
        goto switchD_00363dbb_caseD_6;
      default:
        goto switchD_00363a87_caseD_3;
      case 10:
        goto switchD_00363a87_caseD_5;
      case 0xb:
        goto switchD_00363a87_caseD_6;
      case 0xc:
        goto switchD_00363c03_caseD_c;
      case 0xd:
        goto switchD_00363c73_caseD_d;
      case 0xf:
        goto switchD_00363a87_caseD_a;
      case 0x10:
        goto switchD_00363a87_caseD_b;
      case 0x15:
        goto switchD_00363a87_caseD_10;
      }
    }
LAB_00363df5:
    (local_300->_M_dataplus)._M_p = (pointer)&local_300->field_2;
    pcVar15 = "[]";
    pcVar13 = "";
    goto LAB_00364151;
  case 10:
switchD_00363a87_caseD_a:
    iVar7 = bcmp(pcVar13,"data_flow_graph",__n);
    if (iVar7 == 0) {
      local_2f8._M_dataplus._M_p._0_1_ = 0;
      local_2f8._M_string_length = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_d0,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_2f8,"attributes");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_d0.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_d0.m_value;
      local_d0.m_type = vVar2;
      local_d0.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_d0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2f8,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_e0.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_e0.m_value;
      local_e0.m_type = vVar2;
      local_e0.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_e0);
      local_208.m_type = null;
      local_208._1_7_ = 0;
      local_208.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_208,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2f8,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"id");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_208.m_type;
      local_208.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_208.m_value;
      local_208.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_208);
      local_218.m_type = null;
      local_218._1_7_ = 0;
      local_218.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_218,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2f8,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_218.m_type;
      local_218.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_218.m_value;
      local_218.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_218);
      if ((this->filters).dataStorage.
          super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->filters).dataStorage.
          super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_f0,(initializer_list_t)ZEXT816(0),false,array);
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_2f8,"filters");
        vVar2 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_f0.m_type;
        jVar3 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value = local_f0.m_value;
        local_f0.m_type = vVar2;
        local_f0.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_f0);
        pTVar16 = (TimeCoordinator *)
                  (this->filters).dataStorage.
                  super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_2c0 = (TimeCoordinator *)
                    (this->filters).dataStorage.
                    super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (pTVar16 != local_2c0) {
          paVar1 = &local_2f8.field_2;
          do {
            local_2f8.field_2._M_allocated_capacity =
                 local_2f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_2f8.field_2._8_8_ = 0;
            local_2d8.m_type = null;
            local_2d8._1_7_ = 0;
            local_2d8.m_value.object = (object_t *)0x0;
            nlohmann::json_abi_v3_11_3::detail::
            external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
            construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2d8,
                       (long)(((((__uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
                                  *)&(pTVar16->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator)
                               ->_M_t).
                               super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                               .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl)->
                             handle).hid);
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)paVar1->_M_local_buf,"id");
            vVar2 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_2d8.m_type;
            local_2d8.m_type = vVar2;
            jVar3 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value.object = (object_t *)local_2d8.m_value;
            local_2d8.m_value = jVar3;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_2d8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_288,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &((((__uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
                            *)&(pTVar16->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator)->_M_t
                         ).
                         super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                         .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl)->key);
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)paVar1->_M_local_buf,"name");
            vVar2 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_288.m_type;
            jVar3 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value = local_288.m_value;
            local_288.m_type = vVar2;
            local_288.m_value = jVar3;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_288);
            local_2b8.m_type = null;
            local_2b8._1_7_ = 0;
            local_2b8.m_value.object = (object_t *)0x0;
            nlohmann::json_abi_v3_11_3::detail::
            external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
            construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2b8,
                       ((((__uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
                           *)&(pTVar16->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator)->_M_t)
                        .
                        super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                        .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl)->cloning);
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)paVar1->_M_local_buf,"cloning");
            vVar2 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_2b8.m_type;
            local_2b8.m_type = vVar2;
            jVar3 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value.object = (object_t *)local_2b8.m_value;
            local_2b8.m_value = jVar3;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_2b8);
            generateStringVector<std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>,helics::FilterFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__2>
                      (&local_320,
                       &((((__uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
                            *)&(pTVar16->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator)->_M_t
                         ).
                         super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                         .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl)->
                        sourceTargets);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_298,&local_320);
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)paVar1->_M_local_buf,"source_targets");
            vVar2 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_298.m_type;
            jVar3 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value = local_298.m_value;
            local_298.m_type = vVar2;
            local_298.m_value = jVar3;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_) !=
                &local_320.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_320._M_dataplus._M_p._1_7_,
                                       local_320._M_dataplus._M_p._0_1_),
                              local_320.field_2._M_allocated_capacity + 1);
            }
            generateStringVector<std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>,helics::FilterFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__3>
                      (&local_320,
                       &((((__uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
                            *)&(pTVar16->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator)->_M_t
                         ).
                         super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                         .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl)->
                        destTargets);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2a8,&local_320);
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)paVar1->_M_local_buf,"dest_targets");
            vVar2 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_2a8.m_type;
            jVar3 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value = local_2a8.m_value;
            local_2a8.m_type = vVar2;
            local_2a8.m_value = jVar3;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_2a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_) !=
                &local_320.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_320._M_dataplus._M_p._1_7_,
                                       local_320._M_dataplus._M_p._0_1_),
                              local_320.field_2._M_allocated_capacity + 1);
            }
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&local_2f8,"filters");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)paVar1);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)paVar1);
            pTVar16 = (TimeCoordinator *)&(pTVar16->super_BaseTimeCoordinator).dependencies;
          } while (pTVar16 != local_2c0);
        }
      }
      fileops::generateJsonString(local_300,(json *)&local_2f8,true);
      goto LAB_00364bb7;
    }
    if (__n == 0x10) goto switchD_00363a87_caseD_b;
    if (__n == 0xb) goto switchD_00363a87_caseD_6;
    break;
  case 0xb:
switchD_00363a87_caseD_b:
    iVar7 = bcmp(pcVar13,"dependency_graph",__n);
    if (iVar7 == 0) {
      local_2f8._M_dataplus._M_p._0_1_ = 0;
      local_2f8._M_string_length = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_120,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_2f8,"attributes");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_120.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_120.m_value;
      local_120.m_type = vVar2;
      local_120.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_120);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2f8,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_130.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_130.m_value;
      local_130.m_type = vVar2;
      local_130.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_130);
      local_268.m_type = null;
      local_268._1_7_ = 0;
      local_268.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_268,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2f8,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"id");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_268.m_type;
      local_268.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_268.m_value;
      local_268.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_268);
      local_278.m_type = null;
      local_278._1_7_ = 0;
      local_278.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_278,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2f8,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_278.m_type;
      local_278.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_278.m_value;
      local_278.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_278);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_140,(initializer_list_t)ZEXT816(0),false,array);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_2f8,"dependents");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_140.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_140.m_value;
      local_140.m_type = vVar2;
      local_140.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_140);
      local_2c0 = &this->mCoord;
      TimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_320,local_2c0);
      sVar6 = local_320._M_string_length;
      piVar14 = (int *)CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_);
      if (piVar14 != (int *)local_320._M_string_length) {
        paVar1 = &local_2f8.field_2;
        do {
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&local_2f8,"dependents");
          local_2f8.field_2._M_allocated_capacity = 0;
          local_2f8.field_2._8_8_ = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)paVar1,(long)*piVar14);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)paVar1);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)paVar1);
          piVar14 = piVar14 + 1;
        } while (piVar14 != (int *)sVar6);
      }
      pvVar5 = (void *)CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,local_320.field_2._M_allocated_capacity - (long)pvVar5);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_150,(initializer_list_t)ZEXT816(0),false,array);
      pTVar16 = local_2c0;
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_2f8,"dependencies");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_150.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_150.m_value;
      local_150.m_type = vVar2;
      local_150.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_150);
      TimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_320,pTVar16);
      sVar6 = local_320._M_string_length;
      piVar14 = (int *)CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_);
      if (piVar14 != (int *)local_320._M_string_length) {
        paVar1 = &local_2f8.field_2;
        do {
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&local_2f8,"dependencies");
          local_2f8.field_2._M_allocated_capacity = 0;
          local_2f8.field_2._8_8_ = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)paVar1,(long)*piVar14);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)paVar1);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)paVar1);
          piVar14 = piVar14 + 1;
        } while (piVar14 != (int *)sVar6);
      }
      pvVar5 = (void *)CONCAT71(local_320._M_dataplus._M_p._1_7_,local_320._M_dataplus._M_p._0_1_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,local_320.field_2._M_allocated_capacity - (long)pvVar5);
      }
      fileops::generateJsonString(local_300,(json *)&local_2f8,true);
LAB_00364bb7:
      this_00 = &local_2f8;
LAB_00364fa5:
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)this_00);
      return local_300;
    }
    break;
  case 0xd:
switchD_00363a87_caseD_d:
    iVar7 = bcmp(pcVar13,"filtered_endpoints",__n);
    if (iVar7 == 0) goto LAB_00363df5;
    switch(__n) {
    case 6:
      goto switchD_00363dbb_caseD_6;
    case 9:
      goto switchD_00363a87_caseD_4;
    case 10:
      goto switchD_00363a87_caseD_5;
    case 0xb:
      goto switchD_00363a87_caseD_6;
    case 0xc:
      goto switchD_00363c03_caseD_c;
    case 0xd:
      goto switchD_00363a87_caseD_8;
    case 0xf:
      goto switchD_00363a87_caseD_a;
    case 0x10:
      goto switchD_00363a87_caseD_b;
    case 0x15:
      goto switchD_00363a87_caseD_10;
    }
    break;
  case 0x10:
switchD_00363a87_caseD_10:
    iVar7 = bcmp(pcVar13,"global_time_debugging",__n);
    if (iVar7 == 0) {
      local_320._M_dataplus._M_p._0_1_ = 0;
      local_320._M_string_length = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_a0,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_320,"attributes");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_a0.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_a0.m_value;
      local_a0.m_type = vVar2;
      local_a0.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_a0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_320,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_b0.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_b0.m_value;
      local_b0.m_type = vVar2;
      local_b0.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_b0);
      local_1e8.m_type = null;
      local_1e8._1_7_ = 0;
      local_1e8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1e8,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_320,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"id");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_1e8.m_type;
      local_1e8.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_1e8.m_value;
      local_1e8.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1e8);
      local_1f8.m_type = null;
      local_1f8._1_7_ = 0;
      local_1f8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1f8,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_320,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_1f8.m_type;
      local_1f8.m_type = vVar2;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_1f8.m_value;
      local_1f8.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1f8);
      psVar10 = fedStateString_abi_cxx11_(this->current_state);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_320,"state");
      vVar2 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_c0.m_type;
      jVar3 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_c0.m_value;
      local_c0.m_type = vVar2;
      local_c0.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_c0);
      if ((this->mCoord).super_BaseTimeCoordinator.dependencies.dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&(this->mCoord).super_BaseTimeCoordinator.dependencies.dependencies.
                   super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                   ._M_impl.super__Vector_impl_data + 8)) {
        TimeCoordinator::generateDebuggingTimeInfo(&this->mCoord,(json *)&local_320);
      }
      fileops::generateJsonString(local_300,(json *)&local_320,true);
      goto LAB_00364fa0;
    }
    switch(__n) {
    case 6:
switchD_00363dbb_caseD_6:
      iVar7 = bcmp(pcVar13,"config",__n);
      if (iVar7 == 0) {
        local_320._M_dataplus._M_p._0_1_ = 0;
        local_320._M_string_length = 0;
        TimeCoordinator::generateConfig(&this->mCoord,(json *)&local_320);
        fileops::generateJsonString(local_300,(json *)&local_320,true);
        goto LAB_00364fa0;
      }
      switch(__n) {
      case 10:
switchD_003640ad_caseD_a:
        iVar7 = bcmp(pcVar13,"dependents",__n);
        if (iVar7 == 0) {
          TimeCoordinator::getDependents
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     &local_320,&this->mCoord);
          generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::FilterFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__1>
                    (local_300,&local_320);
LAB_00364fe2:
          pvVar5 = (void *)CONCAT71(local_320._M_dataplus._M_p._1_7_,
                                    local_320._M_dataplus._M_p._0_1_);
          if (pvVar5 == (void *)0x0) {
            return local_300;
          }
          operator_delete(pvVar5,local_320.field_2._M_allocated_capacity - (long)pvVar5);
          return local_300;
        }
        if (__n == 0xb) goto switchD_00363a87_caseD_6;
        if (__n == 0x10) goto switchD_00363a87_caseD_b;
        if (__n == 0xf) goto switchD_00363a87_caseD_a;
        break;
      case 0xb:
        goto switchD_00363a87_caseD_6;
      case 0xf:
        goto switchD_00363a87_caseD_a;
      case 0x10:
        goto switchD_00363a87_caseD_b;
      }
      break;
    case 10:
switchD_00363dbb_caseD_a:
      iVar7 = bcmp(pcVar13,"timeconfig",__n);
      if (iVar7 == 0) {
        local_320._M_dataplus._M_p._0_1_ = 0;
        local_320._M_string_length = 0;
        TimeCoordinator::generateConfig(&this->mCoord,(json *)&local_320);
        fileops::generateJsonString(local_300,(json *)&local_320,true);
        goto LAB_00364fa0;
      }
      switch(__n) {
      case 6:
        goto switchD_00363dbb_caseD_6;
      case 10:
        goto switchD_003640ad_caseD_a;
      case 0xb:
        goto switchD_00363a87_caseD_6;
      case 0xf:
        goto switchD_00363a87_caseD_a;
      case 0x10:
        goto switchD_00363a87_caseD_b;
      }
      break;
    case 0xb:
      goto switchD_00363a87_caseD_6;
    case 0xf:
      goto switchD_00363a87_caseD_a;
    case 0x10:
      goto switchD_00363a87_caseD_b;
    }
  }
switchD_00363a87_caseD_3:
  (local_300->_M_dataplus)._M_p = (pointer)&local_300->field_2;
  pcVar15 = "#invalid";
  pcVar13 = "";
LAB_00364151:
  psVar10 = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,pcVar15,pcVar13);
  return psVar10;
switchD_00363c03_caseD_c:
  iVar7 = bcmp(pcVar13,"dependencies",__n);
  if (iVar7 == 0) {
    TimeCoordinator::getDependencies
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               &local_320,&this->mCoord);
    generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::FilterFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__0>
              (local_300,&local_320);
    goto LAB_00364fe2;
  }
  switch(__n - 6) {
  case 0:
    goto switchD_00363dbb_caseD_6;
  case 4:
    goto switchD_00363dbb_caseD_a;
  case 5:
    goto switchD_00363a87_caseD_6;
  case 6:
    iVar7 = bcmp(pcVar13,"current_time",__n);
    psVar10 = local_300;
    if (iVar7 == 0) {
      TimeCoordinator::printTimeStatus_abi_cxx11_(local_300,&this->mCoord);
      return psVar10;
    }
    switch(__n - 6) {
    case 0:
      goto switchD_00363dbb_caseD_6;
    case 4:
      goto switchD_00363dbb_caseD_a;
    case 5:
      goto switchD_00363a87_caseD_6;
    case 6:
switchD_00363d4f_caseD_c:
      iVar7 = bcmp(pcVar13,"global_state",__n);
      if (iVar7 == 0) {
        local_320._M_dataplus._M_p._0_1_ = 0;
        local_320._M_string_length = 0;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_70,(initializer_list_t)ZEXT816(0),false,object);
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_320,"attributes");
        vVar2 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_70.m_type;
        jVar3 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value = local_70.m_value;
        local_70.m_type = vVar2;
        local_70.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_70);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName
                  );
        pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_320,"attributes");
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar9,"name");
        vVar2 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_80.m_type;
        jVar3 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value = local_80.m_value;
        local_80.m_type = vVar2;
        local_80.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_80);
        local_1c8.m_type = null;
        local_1c8._1_7_ = 0;
        local_1c8.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1c8,(long)(this->mFedID).gid);
        pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_320,"attributes");
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar9,"id");
        vVar2 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_1c8.m_type;
        local_1c8.m_type = vVar2;
        jVar3 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value.object = (object_t *)local_1c8.m_value;
        local_1c8.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1c8);
        local_1d8.m_type = null;
        local_1d8._1_7_ = 0;
        local_1d8.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1d8,(long)(this->mCoreID).gid);
        pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_320,"attributes");
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar9,"parent");
        vVar2 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_1d8.m_type;
        local_1d8.m_type = vVar2;
        jVar3 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value.object = (object_t *)local_1d8.m_value;
        local_1d8.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1d8);
        psVar10 = fedStateString_abi_cxx11_(this->current_state);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10);
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_320,"state");
        vVar2 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_90.m_type;
        jVar3 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value = local_90.m_value;
        local_90.m_type = vVar2;
        local_90.m_value = jVar3;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_90);
        fileops::generateJsonString(local_300,(json *)&local_320,true);
        goto LAB_00364fa0;
      }
      switch(__n) {
      case 10:
        goto switchD_00363dbb_caseD_a;
      case 0xb:
        goto switchD_00363a87_caseD_6;
      case 0xc:
      case 0xd:
      case 0xe:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
        break;
      case 0xf:
        goto switchD_00363a87_caseD_a;
      case 0x10:
        goto switchD_00363a87_caseD_b;
      case 0x15:
        goto switchD_00363a87_caseD_10;
      default:
        if (__n == 6) goto switchD_00363dbb_caseD_6;
      }
      break;
    case 7:
      goto switchD_00363c73_caseD_d;
    case 9:
      goto switchD_00363a87_caseD_a;
    case 10:
      goto switchD_00363a87_caseD_b;
    case 0xf:
      goto switchD_00363a87_caseD_10;
    }
    break;
  case 7:
switchD_00363c73_caseD_d:
    iVar7 = bcmp(pcVar13,"current_state",__n);
    if (iVar7 != 0) {
      switch(__n) {
      case 6:
        goto switchD_00363dbb_caseD_6;
      case 10:
        goto switchD_00363dbb_caseD_a;
      case 0xb:
        goto switchD_00363a87_caseD_6;
      case 0xc:
        goto switchD_00363d4f_caseD_c;
      case 0xf:
        goto switchD_00363a87_caseD_a;
      case 0x10:
        goto switchD_00363a87_caseD_b;
      case 0x15:
        goto switchD_00363a87_caseD_10;
      }
      break;
    }
    local_320._M_dataplus._M_p._0_1_ = 0;
    local_320._M_string_length = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,(initializer_list_t)ZEXT816(0),false,object);
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_320,"attributes");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_40.m_type;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value = local_40.m_value;
    local_40.m_type = vVar2;
    local_40.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_40);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
    pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_320,"attributes");
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar9,"name");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_50.m_type;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value = local_50.m_value;
    local_50.m_type = vVar2;
    local_50.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_50);
    local_168.m_type = null;
    local_168._1_7_ = 0;
    local_168.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_168,(long)(this->mFedID).gid);
    pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_320,"attributes");
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar9,"id");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_168.m_type;
    local_168.m_type = vVar2;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value.object = (object_t *)local_168.m_value;
    local_168.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_168);
    local_178.m_type = null;
    local_178._1_7_ = 0;
    local_178.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_178,(long)(this->mCoreID).gid);
    pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_320,"attributes");
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar9,"parent");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_178.m_type;
    local_178.m_type = vVar2;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value.object = (object_t *)local_178.m_value;
    local_178.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_178);
    psVar10 = fedStateString_abi_cxx11_(this->current_state);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10);
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_320,"state");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_60.m_type;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value = local_60.m_value;
    local_60.m_type = vVar2;
    local_60.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_60);
    local_188.m_type = null;
    local_188._1_7_ = 0;
    local_188.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_188,0);
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_320,"publications");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_188.m_type;
    local_188.m_type = vVar2;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value.object = (object_t *)local_188.m_value;
    local_188.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_188);
    local_198.m_type = null;
    local_198._1_7_ = 0;
    local_198.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_198,0);
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_320,"input");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_198.m_type;
    local_198.m_type = vVar2;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value.object = (object_t *)local_198.m_value;
    local_198.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_198);
    local_1a8.m_type = null;
    local_1a8._1_7_ = 0;
    local_1a8.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_1a8,0);
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_320,"endpoints");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_1a8.m_type;
    local_1a8.m_type = vVar2;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value.object = (object_t *)local_1a8.m_value;
    local_1a8.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_1a8);
    lVar12 = (this->mCoord).time_granted.internalTimeCode;
    local_1b8.m_type = null;
    local_1b8._1_7_ = 0;
    local_1b8.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_1b8,(double)(lVar12 % 1000000000) * 1e-09 + (double)(lVar12 / 1000000000));
    pvVar8 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_320,"granted_time");
    vVar2 = (pvVar8->m_data).m_type;
    (pvVar8->m_data).m_type = local_1b8.m_type;
    local_1b8.m_type = vVar2;
    jVar3 = (pvVar8->m_data).m_value;
    (pvVar8->m_data).m_value.object = (object_t *)local_1b8.m_value;
    local_1b8.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_1b8);
    fileops::generateJsonString(local_300,(json *)&local_320,true);
    goto LAB_00364fa0;
  case 9:
    goto switchD_00363a87_caseD_a;
  case 10:
    goto switchD_00363a87_caseD_b;
  case 0xf:
    goto switchD_00363a87_caseD_10;
  }
  goto switchD_00363a87_caseD_3;
}

Assistant:

std::string FilterFederate::query(std::string_view queryStr) const
{
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return versionString;
    }
    if (queryStr == "isinit") {
        return "true";
    }
    if (queryStr == "state") {
        return fedStateString(current_state);
    }

    if (queryStr == "publications" || queryStr == "inputs" || queryStr == "filtered_endpoints" ||
        queryStr == "endpoints" || queryStr == "subscriptions") {
        return "[]";
    }

    if (queryStr == "interfaces") {
        return "[]";
    }

    if (queryStr == "dependencies") {
        return generateStringVector(mCoord.getDependencies(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (queryStr == "current_time") {
        return mCoord.printTimeStatus();
    }
    if (queryStr == "current_state") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["state"] = fedStateString(current_state);
        base["publications"] = 0;
        base["input"] = 0;
        base["endpoints"] = 0;
        base["granted_time"] = static_cast<double>(mCoord.getGrantedTime());
        return fileops::generateJsonString(base);
    }
    if (queryStr == "global_state") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["state"] = fedStateString(current_state);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "global_time_debugging") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["state"] = fedStateString(current_state);
        if (!mCoord.empty()) {
            mCoord.generateDebuggingTimeInfo(base);
        }
        return fileops::generateJsonString(base);
    }
    if (queryStr == "timeconfig") {
        nlohmann::json base;
        mCoord.generateConfig(base);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "config") {
        nlohmann::json base;
        mCoord.generateConfig(base);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "dependents") {
        return generateStringVector(mCoord.getDependents(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (queryStr == "data_flow_graph") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        if (filters.size() > 0) {
            base["filters"] = nlohmann::json::array();
            for (const auto& filt : filters) {
                nlohmann::json filter;
                filter["id"] = filt->handle.baseValue();
                filter["name"] = filt->key;
                filter["cloning"] = filt->cloning;
                filter["source_targets"] = generateStringVector(filt->sourceTargets, [](auto& dep) {
                    return std::to_string(dep.fed_id.baseValue()) +
                        "::" + std::to_string(dep.handle.baseValue());
                });
                filter["dest_targets"] = generateStringVector(filt->destTargets, [](auto& dep) {
                    return std::to_string(dep.fed_id.baseValue()) +
                        "::" + std::to_string(dep.handle.baseValue());
                });
                base["filters"].push_back(std::move(filter));
            }
        }
        return fileops::generateJsonString(base);
    }
    if (queryStr == "global_time") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["granted_time"] = static_cast<double>(mCoord.getGrantedTime());
        base["send_time"] = static_cast<double>(mCoord.allowedSendTime());
        return fileops::generateJsonString(base);
    }
    if (queryStr == "dependency_graph") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["dependents"] = nlohmann::json::array();
        for (auto& dep : mCoord.getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (auto& dep : mCoord.getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }

    return "#invalid";
}